

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.h
# Opt level: O2

void removeDirectory(string *path)

{
  long lVar1;
  char *__s2;
  int iVar2;
  int iVar3;
  int parentid;
  long lVar4;
  ostream *poVar5;
  undefined1 *puVar6;
  string sStack_d28;
  char *local_d08;
  long local_d00;
  char *local_ce8;
  long local_ce0;
  char *local_cc8;
  long local_cc0;
  undefined8 auStack_cb8 [2];
  string names [100];
  
  lVar4 = 0x10;
  do {
    puVar6 = (undefined1 *)((long)&names[0]._M_dataplus._M_p + lVar4);
    *(undefined1 **)((long)auStack_cb8 + lVar4) = puVar6;
    *(undefined8 *)((long)auStack_cb8 + lVar4 + 8) = 0;
    *puVar6 = 0;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0xc90);
  std::__cxx11::string::string((string *)&sStack_d28,(string *)path);
  iVar2 = parsePath(&sStack_d28,names);
  std::__cxx11::string::~string((string *)&sStack_d28);
  std::__cxx11::string::string((string *)&local_cc8,(string *)path);
  iVar3 = doesExist(names,iVar2,local_cc0 == 0 || *local_cc8 != '/');
  std::__cxx11::string::~string((string *)&local_cc8);
  if (iVar3 == iVar2) {
    std::__cxx11::string::string((string *)&local_ce8,(string *)path);
    iVar3 = getId(names,iVar2,local_ce0 == 0 || *local_ce8 != '/');
    std::__cxx11::string::~string((string *)&local_ce8);
    std::__cxx11::string::string((string *)&local_d08,(string *)path);
    parentid = getId(names,iVar2 + -1,local_d00 == 0 || *local_d08 != '/');
    std::__cxx11::string::~string((string *)&local_d08);
    delDirOrFile(iVar3,parentid);
    iVar3 = inodes[parentid].i_blocks[0];
    __s2 = names[(long)iVar2 + -1]._M_dataplus._M_p;
    lVar4 = 0;
    do {
      lVar1 = lVar4 + 0x100;
      if (lVar1 == 0x1100) goto LAB_0010351e;
      iVar2 = strcmp(emptyspaces + lVar4 + (long)iVar3 * 0x1000,__s2);
      lVar4 = lVar1;
    } while (iVar2 != 0);
    memset(emptyspaces + lVar1 + (long)iVar3 * 0x1000 + -0x100,0,0x100);
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,"Path is illegal");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
LAB_0010351e:
  lVar4 = 0xc60;
  do {
    std::__cxx11::string::~string((string *)((long)&names[0]._M_dataplus._M_p + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  return;
}

Assistant:

void removeDirectory(string path) {
    string names[100];
    int layers = parsePath(path, names);
    int legal_layers = doesExist(names, layers, getPathType(path) == RELATIVE_PATH);
    if (legal_layers == layers) {
        int id = getId(names, layers, getPathType(path) == RELATIVE_PATH);
        int parentid = getId(names, layers - 1, getPathType(path) == RELATIVE_PATH);
        delDirOrFile(id, parentid);
        dir_block *parent = getAddressByLocation_Folder(inodes[parentid].i_blocks[0]);
        for (int i = 0; i < 16; i++) {
            if (strcmp(parent->dirs[i].name, names[layers - 1].c_str()) == 0) {
                dir_entry *temp = &parent->dirs[i];
                memset(temp, '\0', sizeof(dir_entry));
                break;
            }
        }
    }
    else {
        setColor(COLOR_ERR);
        cout << "Path is illegal" << endl;
        setColor(COLOR_ORIGIN);
    }
}